

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::z_formatter<spdlog::details::null_scoped_padder>::format
          (z_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *tm_time,
          memory_buf_t *dest)

{
  long lVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  size_t sVar4;
  format_string_checker<char,_1,_0,_false> *handler;
  buffer<char> *buf;
  ulong uVar5;
  uint uVar6;
  basic_string_view<char> fmt;
  string_view fmt_00;
  format_args args;
  uint local_78 [2];
  undefined8 local_70;
  undefined4 local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 *local_48;
  code *local_40;
  
  lVar1 = (msg->time).__d.__r;
  if (lVar1 - (this->last_update_).__d.__r < 10000000000) {
    uVar6 = this->offset_minutes_;
  }
  else {
    auVar2 = SEXT816(tm_time->tm_gmtoff) * ZEXT816(0x8888888888888889);
    uVar6 = (int)(auVar2._8_8_ >> 5) - (auVar2._12_4_ >> 0x1f);
    this->offset_minutes_ = uVar6;
    (this->last_update_).__d.__r = lVar1;
  }
  if ((int)uVar6 < 0) {
    sVar4 = (dest->super_buffer<char>).size_;
    uVar5 = sVar4 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar4 = (dest->super_buffer<char>).size_;
      uVar5 = sVar4 + 1;
    }
    uVar6 = -uVar6;
    handler = (format_string_checker<char,_1,_0,_false> *)(dest->super_buffer<char>).ptr_;
    (dest->super_buffer<char>).size_ = uVar5;
    *(char *)((long)handler->types_ + sVar4) = '-';
  }
  else {
    sVar4 = (dest->super_buffer<char>).size_;
    uVar5 = sVar4 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar4 = (dest->super_buffer<char>).size_;
      uVar5 = sVar4 + 1;
    }
    handler = (format_string_checker<char,_1,_0,_false> *)(dest->super_buffer<char>).ptr_;
    (dest->super_buffer<char>).size_ = uVar5;
    *(char *)((long)handler->types_ + sVar4) = '+';
  }
  if (uVar6 < 6000) {
    bVar3 = (byte)((uVar6 / 0x3c & 0xff) / 10);
    sVar4 = (dest->super_buffer<char>).size_;
    uVar5 = sVar4 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar4 = (dest->super_buffer<char>).size_;
      uVar5 = sVar4 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar4] = bVar3 | 0x30;
    sVar4 = (dest->super_buffer<char>).size_;
    uVar5 = sVar4 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar4 = (dest->super_buffer<char>).size_;
      uVar5 = sVar4 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar4] = (char)((ulong)uVar6 / 0x3c) + bVar3 * -10 | 0x30;
  }
  else {
    local_78[0] = 1;
    local_70 = 0;
    local_68 = 0;
    local_60 = "{:02}";
    local_58 = 5;
    local_50 = 0x100000000;
    local_40 = ::fmt::v11::detail::invoke_parse<int&,char>;
    fmt.size_ = (size_t)local_78;
    fmt.data_ = (char *)0x5;
    local_48 = (undefined1 *)local_78;
    ::fmt::v11::detail::
    parse_format_string<char,fmt::v11::detail::format_string_checker<char,1,0,false>>
              ((detail *)"{:02}",fmt,handler);
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_78;
    args.desc_ = 1;
    local_78[0] = uVar6 / 0x3c;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_00,args,(locale_ref)0x0);
  }
  sVar4 = (dest->super_buffer<char>).size_;
  uVar5 = sVar4 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar5) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
    sVar4 = (dest->super_buffer<char>).size_;
    uVar5 = sVar4 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar5;
  (dest->super_buffer<char>).ptr_[sVar4] = ':';
  bVar3 = (byte)((uVar6 % 0x3c) / 10);
  sVar4 = (dest->super_buffer<char>).size_;
  uVar5 = sVar4 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar5) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
    sVar4 = (dest->super_buffer<char>).size_;
    uVar5 = sVar4 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar5;
  (dest->super_buffer<char>).ptr_[sVar4] = bVar3 | 0x30;
  sVar4 = (dest->super_buffer<char>).size_;
  uVar5 = sVar4 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar5) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
    sVar4 = (dest->super_buffer<char>).size_;
    uVar5 = sVar4 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar5;
  (dest->super_buffer<char>).ptr_[sVar4] = (char)(uVar6 % 0x3c) + bVar3 * -10 | 0x30;
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 6;
        ScopedPadder p(field_size, padinfo_, dest);

        auto total_minutes = get_cached_offset(msg, tm_time);
        bool is_negative = total_minutes < 0;
        if (is_negative) {
            total_minutes = -total_minutes;
            dest.push_back('-');
        } else {
            dest.push_back('+');
        }

        fmt_helper::pad2(total_minutes / 60, dest);  // hours
        dest.push_back(':');
        fmt_helper::pad2(total_minutes % 60, dest);  // minutes
    }